

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<std::complex<long_double>_> * __thiscall
TPZVec<std::complex<long_double>_>::operator=
          (TPZVec<std::complex<long_double>_> *this,TPZVec<std::complex<long_double>_> *rval)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  complex<long_double> *pcVar7;
  long lVar8;
  long lVar9;
  complex<long_double> *pcVar10;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (complex<long_double> *)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar3 = this->fNElements;
      pcVar7 = (complex<long_double> *)operator_new__(-(ulong)(uVar3 >> 0x3b != 0) | uVar3 * 0x20);
      if (uVar3 != 0) {
        pcVar10 = pcVar7;
        do {
          *(longdouble *)pcVar10->_M_value = (longdouble)0;
          *(longdouble *)((long)pcVar10->_M_value + 0x10) = (longdouble)0;
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 != pcVar7 + uVar3);
      }
      this->fStore = pcVar7;
      if (0 < this->fNElements) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          pcVar7 = this->fStore;
          puVar1 = (undefined8 *)(rval->fStore->_M_value + lVar8);
          uVar4 = *puVar1;
          uVar5 = puVar1[1];
          puVar1 = (undefined8 *)(rval->fStore->_M_value + lVar8 + 0x10);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)(pcVar7->_M_value + lVar8 + 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)(pcVar7->_M_value + lVar8);
          *puVar1 = uVar4;
          puVar1[1] = uVar5;
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (lVar9 < this->fNElements);
      }
    }
    else {
      this->fStore = rval->fStore;
    }
    this->fNAlloc = this->fNElements;
    rval->fStore = (complex<long_double> *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}